

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

bool __thiscall
pybind11::detail::
list_caster<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>::load
          (list_caster<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int> *this
          ,handle src,bool convert)

{
  bool bVar1;
  template_cast_op_type<typename_std::add_rvalue_reference<unsigned_int_&&>::type> __x;
  sequence_iterator sVar2;
  sequence_slow_readwrite sVar3;
  handle local_c0;
  PyObject *local_b8;
  type_caster<unsigned_int,_void> local_ac;
  undefined1 local_a8 [4];
  value_conv conv;
  reference it;
  sequence_iterator __end3;
  sequence_iterator __begin3;
  sequence *__range3;
  sequence local_50;
  PyObject *local_48;
  sequence local_40;
  sequence s;
  bool convert_local;
  list_caster<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int> *this_local;
  handle src_local;
  
  bVar1 = isinstance<pybind11::sequence,_0>(src);
  if ((!bVar1) ||
     (s.super_object.super_handle.m_ptr = (object)(object)src.m_ptr,
     bVar1 = isinstance<pybind11::str,_0>(src), bVar1)) {
    src_local.m_ptr._7_1_ = 0;
  }
  else {
    local_48 = src.m_ptr;
    reinterpret_borrow<pybind11::sequence>((pybind11 *)&local_40,src);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->value);
    sequence::sequence(&local_50,&local_40);
    reserve_maybe<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_0>
              (this,&local_50,&this->value);
    sequence::~sequence(&local_50);
    sVar2 = sequence::begin(&local_40);
    __end3.super_sequence_slow_readwrite.index =
         (ssize_t)sVar2.super_sequence_slow_readwrite.obj.m_ptr;
    sVar3 = (sequence_slow_readwrite)sequence::end(&local_40);
    while( true ) {
      __end3.super_sequence_slow_readwrite.obj.m_ptr = (PyObject *)sVar3.index;
      it.cache.super_handle.m_ptr = sVar3.obj.m_ptr;
      bVar1 = detail::operator!=((It *)&__end3.super_sequence_slow_readwrite.index,(It *)&it.cache);
      if (!bVar1) break;
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator*
                ((reference *)local_a8,
                 (generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite> *)
                 &__end3.super_sequence_slow_readwrite.index);
      accessor::operator_cast_to_object((accessor *)&local_c0);
      local_b8 = local_c0.m_ptr;
      bVar1 = type_caster<unsigned_int,_void>::load(&local_ac,local_c0,convert);
      object::~object((object *)&local_c0);
      bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
      if (bVar1) {
        src_local.m_ptr._7_1_ = 0;
      }
      else {
        __x = cast_op<unsigned_int&&>(&local_ac);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->value,__x);
      }
      accessor<pybind11::detail::accessor_policies::sequence_item>::~accessor
                ((accessor<pybind11::detail::accessor_policies::sequence_item> *)local_a8);
      if (bVar1) goto LAB_00152afc;
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator++
                ((generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite> *)
                 &__end3.super_sequence_slow_readwrite.index);
      sVar3.index = (ssize_t)__end3.super_sequence_slow_readwrite.obj.m_ptr;
      sVar3.obj = it.cache.super_handle.m_ptr;
    }
    src_local.m_ptr._7_1_ = 1;
LAB_00152afc:
    sequence::~sequence(&local_40);
  }
  return (bool)(src_local.m_ptr._7_1_ & 1);
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<str>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }